

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O1

section_t * get_section_by_id(int id)

{
  section_s *psVar1;
  
  for (psVar1 = root; (psVar1 != (section_t *)0x0 && (psVar1->id != id)); psVar1 = psVar1->next) {
  }
  return psVar1;
}

Assistant:

section_t* get_section_by_id(int id)
{
    section_t* ps = root;
    while (ps)
    {
        if (ps->id == id)
            break;
        ps = ps->next;
    }
    return ps;
}